

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  secp256k1_scalar *psVar6;
  ulong uVar7;
  char *extraout_RDX;
  secp256k1_context *a;
  undefined1 *puVar8;
  secp256k1_context *ctx;
  secp256k1_fe *psVar9;
  secp256k1_scalar *psVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  secp256k1_context *r_00;
  undefined1 auVar18 [16];
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  uchar auStack_220 [72];
  secp256k1_context *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_context *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_scalar *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [104];
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  secp256k1_scalar *local_118;
  uint local_110;
  undefined4 local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  undefined4 local_38;
  
  r_00 = (secp256k1_context *)local_198;
  pcStack_1b0 = (code *)0x129dfa;
  psVar6 = q;
  secp256k1_fe_sqr((secp256k1_fe *)r_00,n);
  pcStack_1b0 = (code *)0x129e08;
  secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    pcStack_1b0 = (code *)0x12a002;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 7;
    local_198._40_4_ = local_198._40_4_ + 1;
    local_198._44_4_ = 0;
    pcStack_1b0 = (code *)0x12a018;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      psVar9 = (secp256k1_fe *)local_198;
LAB_0012a021:
      pcStack_1b0 = (code *)0x12a026;
      iVar3 = secp256k1_fe_is_square_var(psVar9);
      if (iVar3 == 0) {
        return 0;
      }
    }
LAB_0012a02e:
    r = (secp256k1_fe *)local_198;
    pcStack_1b0 = (code *)0x12a046;
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffff68,r,n);
    n = (secp256k1_fe *)&stack0xffffffffffffff98;
    pcStack_1b0 = (code *)0x12a059;
    a = (secp256k1_context *)r;
    secp256k1_fe_sqr(n,r);
    local_38 = 0;
    pcStack_1b0 = (code *)0x12a06a;
    ctx = (secp256k1_context *)q;
    secp256k1_scalar_verify(q);
    auVar18._0_4_ = -(uint)((int)q->d[2] == 0 && (int)q->d[0] == 0);
    auVar18._4_4_ = -(uint)(*(int *)((long)q->d + 0x14) == 0 && *(int *)((long)q->d + 4) == 0);
    auVar18._8_4_ = -(uint)((int)q->d[3] == 0 && (int)q->d[1] == 0);
    auVar18._12_4_ = -(uint)(*(int *)((long)q->d + 0x1c) == 0 && *(int *)((long)q->d + 0xc) == 0);
    iVar3 = movmskps(extraout_EAX,auVar18);
    if (iVar3 == 0xf) {
      pcStack_1b0 = (code *)0x12a132;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)(local_198 + 0x60);
      a = (secp256k1_context *)&stack0xffffffffffffff68;
      pcStack_1b0 = (code *)0x12a0a5;
      secp256k1_ecmult_const((secp256k1_gej *)r,(secp256k1_ge *)a,q);
      pcStack_1b0 = (code *)0x12a0ad;
      ctx = (secp256k1_context *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        psVar9 = (secp256k1_fe *)(local_198 + 0x30);
        pcStack_1b0 = (code *)0x12a0cb;
        secp256k1_fe_sqr(psVar9,&local_d8);
        pcStack_1b0 = (code *)0x12a0db;
        secp256k1_fe_mul(psVar9,psVar9,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          pcStack_1b0 = (code *)0x12a0f0;
          secp256k1_fe_mul((secp256k1_fe *)(local_198 + 0x30),(secp256k1_fe *)(local_198 + 0x30),d);
        }
        psVar9 = (secp256k1_fe *)(local_198 + 0x30);
        pcStack_1b0 = (code *)0x12a100;
        secp256k1_fe_inv(psVar9,psVar9);
        pcStack_1b0 = (code *)0x12a112;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)(local_198 + 0x60),psVar9);
        return 1;
      }
    }
    pcStack_1b0 = (code *)0x12a137;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_0012a137:
    pcStack_1b0 = (code *)0x12a13c;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    pcStack_1b0 = (code *)0x129e1e;
    secp256k1_fe_verify(d);
    psVar6 = (secp256k1_scalar *)0x1000003d0;
    uVar5 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar7 = (uVar5 >> 0x34) + d->n[1];
    a = (secp256k1_context *)((uVar7 >> 0x34) + d->n[2]);
    ctx = (secp256k1_context *)(((ulong)a >> 0x34) + d->n[3]);
    uVar12 = ((ulong)ctx >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar7 | uVar5 | (ulong)a | (ulong)ctx) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
       (((uVar5 ^ 0x1000003d0) & uVar7 & (ulong)a & (ulong)ctx & (uVar12 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_0012a137;
    r_00 = (secp256k1_context *)(local_198 + 0x60);
    pcStack_1b0 = (code *)0x129eca;
    a = (secp256k1_context *)d;
    secp256k1_fe_sqr((secp256k1_fe *)r_00,d);
    pcStack_1b0 = (code *)0x129ed2;
    ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if ((int)local_110 < 5) {
      local_110 = local_110 * 7;
      psVar6 = (secp256k1_scalar *)(ulong)local_110;
      r_00 = (secp256k1_context *)(local_198 + 0x60);
      local_198._96_8_ = local_198._96_8_ * 7;
      uStack_130 = uStack_130 * 7;
      local_128 = local_128 * 7;
      uStack_120 = uStack_120 * 7;
      local_118 = (secp256k1_scalar *)((long)local_118 * 7);
      local_10c = 0;
      pcStack_1b0 = (code *)0x129f60;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      pcStack_1b0 = (code *)0x129f6e;
      a = r_00;
      secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,d);
      r = (secp256k1_fe *)local_198;
      pcStack_1b0 = (code *)0x129f7b;
      secp256k1_fe_verify(r);
      pcStack_1b0 = (code *)0x129f83;
      ctx = r_00;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < (int)(local_110 + local_198._40_4_)) goto LAB_0012a141;
      local_198._0_8_ = local_198._0_8_ + local_198._96_8_;
      local_198._8_8_ = local_198._8_8_ + uStack_130;
      local_198._16_8_ = local_198._16_8_ + local_128;
      local_198._24_8_ = local_198._24_8_ + uStack_120;
      local_198._32_8_ = (long)local_118->d + local_198._32_8_;
      local_198._44_4_ = 0;
      pcStack_1b0 = (code *)0x129fd4;
      psVar6 = local_118;
      local_198._40_4_ = local_110 + local_198._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        psVar9 = (secp256k1_fe *)&stack0xffffffffffffff68;
        pcStack_1b0 = (code *)0x129ff0;
        secp256k1_fe_mul(psVar9,(secp256k1_fe *)local_198,d);
        goto LAB_0012a021;
      }
      goto LAB_0012a02e;
    }
  }
  pcStack_1b0 = (code *)0x12a141;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_0012a141:
  pcStack_1b0 = ecdsa_signature_parse_der_lax;
  secp256k1_ecmult_const_xonly_cold_2();
  auStack_220[0x30] = '\0';
  auStack_220[0x31] = '\0';
  auStack_220[0x32] = '\0';
  auStack_220[0x33] = '\0';
  auStack_220[0x34] = '\0';
  auStack_220[0x35] = '\0';
  auStack_220[0x36] = '\0';
  auStack_220[0x37] = '\0';
  auStack_220[0x38] = '\0';
  auStack_220[0x39] = '\0';
  auStack_220[0x3a] = '\0';
  auStack_220[0x3b] = '\0';
  auStack_220[0x3c] = '\0';
  auStack_220[0x3d] = '\0';
  auStack_220[0x3e] = '\0';
  auStack_220[0x3f] = '\0';
  auStack_220[0x20] = '\0';
  auStack_220[0x21] = '\0';
  auStack_220[0x22] = '\0';
  auStack_220[0x23] = '\0';
  auStack_220[0x24] = '\0';
  auStack_220[0x25] = '\0';
  auStack_220[0x26] = '\0';
  auStack_220[0x27] = '\0';
  auStack_220[0x28] = '\0';
  auStack_220[0x29] = '\0';
  auStack_220[0x2a] = '\0';
  auStack_220[0x2b] = '\0';
  auStack_220[0x2c] = '\0';
  auStack_220[0x2d] = '\0';
  auStack_220[0x2e] = '\0';
  auStack_220[0x2f] = '\0';
  auStack_220[0x10] = '\0';
  auStack_220[0x11] = '\0';
  auStack_220[0x12] = '\0';
  auStack_220[0x13] = '\0';
  auStack_220[0x14] = '\0';
  auStack_220[0x15] = '\0';
  auStack_220[0x16] = '\0';
  auStack_220[0x17] = '\0';
  auStack_220[0x18] = '\0';
  auStack_220[0x19] = '\0';
  auStack_220[0x1a] = '\0';
  auStack_220[0x1b] = '\0';
  auStack_220[0x1c] = '\0';
  auStack_220[0x1d] = '\0';
  auStack_220[0x1e] = '\0';
  auStack_220[0x1f] = '\0';
  auStack_220[0] = '\0';
  auStack_220[1] = '\0';
  auStack_220[2] = '\0';
  auStack_220[3] = '\0';
  auStack_220[4] = '\0';
  auStack_220[5] = '\0';
  auStack_220[6] = '\0';
  auStack_220[7] = '\0';
  auStack_220[8] = '\0';
  auStack_220[9] = '\0';
  auStack_220[10] = '\0';
  auStack_220[0xb] = '\0';
  auStack_220[0xc] = '\0';
  auStack_220[0xd] = '\0';
  auStack_220[0xe] = '\0';
  auStack_220[0xf] = '\0';
  psStack_1d8 = (secp256k1_context *)r;
  psStack_1d0 = n;
  psStack_1c8 = r_00;
  psStack_1c0 = d;
  psStack_1b8 = q;
  pcStack_1b0 = (code *)(ulong)(uint)known_on_curve;
  secp256k1_ecdsa_signature_parse_compact(ctx,(secp256k1_ecdsa_signature *)a,auStack_220);
  iVar4 = 0;
  iVar3 = 0;
  if (((psVar6 != (secp256k1_scalar *)0x0) && (psVar6 != (secp256k1_scalar *)0x1)) &&
     (iVar3 = iVar4, *extraout_RDX == '0')) {
    bVar1 = extraout_RDX[1];
    psVar10 = (secp256k1_scalar *)0x2;
    if ((char)bVar1 < '\0') {
      if ((undefined1 *)((long)psVar6[-1].d + 0x1eU) < (undefined1 *)((ulong)bVar1 - 0x80)) {
        return 0;
      }
      psVar10 = (secp256k1_scalar *)((ulong)bVar1 - 0x7e);
    }
    if (((psVar10 != psVar6) && (extraout_RDX[(long)psVar10] == '\x02')) &&
       ((secp256k1_scalar *)((long)psVar10->d + 1) != psVar6)) {
      puVar17 = (undefined1 *)((long)psVar10->d + 2);
      uVar5 = (ulong)(byte)(extraout_RDX + 1)[(long)psVar10];
      if ((extraout_RDX + 1)[(long)psVar10] < '\0') {
        uVar7 = uVar5 - 0x80;
        if ((ulong)((long)psVar6 - (long)puVar17) < uVar7) {
          return 0;
        }
        if (uVar7 != 0) {
          puVar8 = (undefined1 *)((long)psVar10->d + (uVar5 - 0x7e));
          uVar5 = 0;
          lVar11 = 0;
          pcVar15 = extraout_RDX;
LAB_0012a294:
          if (pcVar15[(long)puVar17] == '\0') goto code_r0x0012a29b;
          if (7 < uVar7 + lVar11) {
            return 0;
          }
          uVar12 = -lVar11;
          uVar5 = 0;
          do {
            uVar5 = (ulong)(byte)(extraout_RDX + (long)puVar17)[uVar12] | uVar5 << 8;
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
          puVar17 = puVar17 + ((uVar7 + lVar11) - lVar11);
          goto LAB_0012a1fb;
        }
        uVar5 = 0;
        puVar8 = puVar17;
      }
      else {
LAB_0012a1fb:
        puVar8 = puVar17;
        if ((ulong)((long)psVar6 - (long)puVar17) < uVar5) {
          return 0;
        }
      }
LAB_0012a206:
      psVar10 = (secp256k1_scalar *)(puVar8 + uVar5);
      if (((psVar10 != psVar6) && (extraout_RDX[(long)psVar10] == '\x02')) &&
         ((secp256k1_scalar *)((long)psVar10->d + 1) != psVar6)) {
        puVar17 = (undefined1 *)((long)psVar10->d + 2);
        uVar7 = (ulong)(byte)(extraout_RDX + 1)[(long)psVar10];
        if ((extraout_RDX + 1)[(long)psVar10] < '\0') {
          uVar12 = uVar7 - 0x80;
          if ((ulong)((long)psVar6 - (long)puVar17) < uVar12) {
            return 0;
          }
          if (uVar12 != 0) {
            puVar16 = (undefined1 *)((long)psVar10->d + (uVar7 - 0x7e));
            uVar7 = 0;
            uVar13 = 0;
LAB_0012a31e:
            if ((extraout_RDX + (long)puVar17)[uVar13] == '\0') goto code_r0x0012a329;
            if (7 < uVar12 - uVar13) {
              return 0;
            }
            uVar7 = 0;
            uVar14 = uVar13;
            do {
              uVar7 = (ulong)(byte)(extraout_RDX + (long)puVar17)[uVar14] | uVar7 << 8;
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
            puVar17 = puVar17 + (uVar12 - uVar13) + uVar13;
            goto LAB_0012a232;
          }
          uVar7 = 0;
          puVar16 = puVar17;
        }
        else {
LAB_0012a232:
          puVar16 = puVar17;
          if ((ulong)((long)psVar6 - (long)puVar17) < uVar7) {
            return 0;
          }
        }
LAB_0012a23a:
        bVar2 = true;
        if (uVar5 != 0) {
          uVar12 = 0;
          do {
            if ((puVar8 + (long)extraout_RDX)[uVar12] != '\0') {
              if (uVar5 - uVar12 < 0x21) {
                memcpy(auStack_220 + (uVar12 - uVar5) + 0x20,puVar8 + (long)extraout_RDX + uVar12,
                       uVar5 - uVar12);
              }
              else {
                bVar2 = false;
              }
              break;
            }
            uVar12 = uVar12 + 1;
          } while (uVar5 != uVar12);
        }
        if (uVar7 != 0) {
          uVar5 = 0;
          do {
            if ((extraout_RDX + (long)puVar16)[uVar5] != '\0') {
              if (0x20 < uVar7 - uVar5) goto LAB_0012a3ca;
              memcpy(auStack_220 + (uVar5 - uVar7) + 0x40,extraout_RDX + (long)puVar16 + uVar5,
                     uVar7 - uVar5);
              break;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        if ((bVar2) &&
           (iVar3 = secp256k1_ecdsa_signature_parse_compact
                              (ctx,(secp256k1_ecdsa_signature *)a,auStack_220), iVar3 != 0)) {
          return 1;
        }
LAB_0012a3ca:
        auStack_220[0x30] = '\0';
        auStack_220[0x31] = '\0';
        auStack_220[0x32] = '\0';
        auStack_220[0x33] = '\0';
        auStack_220[0x34] = '\0';
        auStack_220[0x35] = '\0';
        auStack_220[0x36] = '\0';
        auStack_220[0x37] = '\0';
        auStack_220[0x38] = '\0';
        auStack_220[0x39] = '\0';
        auStack_220[0x3a] = '\0';
        auStack_220[0x3b] = '\0';
        auStack_220[0x3c] = '\0';
        auStack_220[0x3d] = '\0';
        auStack_220[0x3e] = '\0';
        auStack_220[0x3f] = '\0';
        auStack_220[0x20] = '\0';
        auStack_220[0x21] = '\0';
        auStack_220[0x22] = '\0';
        auStack_220[0x23] = '\0';
        auStack_220[0x24] = '\0';
        auStack_220[0x25] = '\0';
        auStack_220[0x26] = '\0';
        auStack_220[0x27] = '\0';
        auStack_220[0x28] = '\0';
        auStack_220[0x29] = '\0';
        auStack_220[0x2a] = '\0';
        auStack_220[0x2b] = '\0';
        auStack_220[0x2c] = '\0';
        auStack_220[0x2d] = '\0';
        auStack_220[0x2e] = '\0';
        auStack_220[0x2f] = '\0';
        auStack_220[0x10] = '\0';
        auStack_220[0x11] = '\0';
        auStack_220[0x12] = '\0';
        auStack_220[0x13] = '\0';
        auStack_220[0x14] = '\0';
        auStack_220[0x15] = '\0';
        auStack_220[0x16] = '\0';
        auStack_220[0x17] = '\0';
        auStack_220[0x18] = '\0';
        auStack_220[0x19] = '\0';
        auStack_220[0x1a] = '\0';
        auStack_220[0x1b] = '\0';
        auStack_220[0x1c] = '\0';
        auStack_220[0x1d] = '\0';
        auStack_220[0x1e] = '\0';
        auStack_220[0x1f] = '\0';
        auStack_220[0] = '\0';
        auStack_220[1] = '\0';
        auStack_220[2] = '\0';
        auStack_220[3] = '\0';
        auStack_220[4] = '\0';
        auStack_220[5] = '\0';
        auStack_220[6] = '\0';
        auStack_220[7] = '\0';
        auStack_220[8] = '\0';
        auStack_220[9] = '\0';
        auStack_220[10] = '\0';
        auStack_220[0xb] = '\0';
        auStack_220[0xc] = '\0';
        auStack_220[0xd] = '\0';
        auStack_220[0xe] = '\0';
        auStack_220[0xf] = '\0';
        secp256k1_ecdsa_signature_parse_compact(ctx,(secp256k1_ecdsa_signature *)a,auStack_220);
        iVar3 = 1;
      }
    }
  }
  return iVar3;
code_r0x0012a29b:
  lVar11 = lVar11 + -1;
  pcVar15 = pcVar15 + 1;
  if (uVar7 + lVar11 == 0) goto LAB_0012a206;
  goto LAB_0012a294;
code_r0x0012a329:
  uVar13 = uVar13 + 1;
  if (uVar12 == uVar13) goto LAB_0012a23a;
  goto LAB_0012a31e;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}